

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

Vec_Int_t * Pdr_ManDeriveInfinityClauses(Pdr_Man_t *p,int fReduce)

{
  int iVar1;
  Vec_Ptr_t *vCubes;
  Vec_Int_t *p_00;
  void *pvVar2;
  int Addition;
  long lVar3;
  Vec_Ptr_t *__ptr;
  int i;
  
  iVar1 = Pdr_ManFindInvariantStart(p);
  vCubes = Pdr_ManCollectCubes(p,iVar1);
  if (fReduce != 0) {
    do {
      iVar1 = Pdr_ManDeriveMarkNonInductive(p,vCubes);
    } while (iVar1 != 0);
  }
  p_00 = Vec_IntAlloc(1000);
  Vec_IntPush(p_00,0);
  iVar1 = vCubes->nSize;
  for (i = 0; i < iVar1; i = i + 1) {
    pvVar2 = Vec_PtrEntry(vCubes,i);
    if (*(int *)((long)pvVar2 + 8) != -1) {
      Vec_IntAddToEntry(p_00,0,Addition);
      Vec_IntPush(p_00,*(int *)((long)pvVar2 + 0x10));
      for (lVar3 = 0; lVar3 < *(int *)((long)pvVar2 + 0x10); lVar3 = lVar3 + 1) {
        Vec_IntPush(p_00,*(int *)((long)pvVar2 + lVar3 * 4 + 0x14));
      }
    }
  }
  __ptr = p->vInfCubes;
  if (__ptr != (Vec_Ptr_t *)0x0) {
    if (__ptr->pArray != (void **)0x0) {
      free(__ptr->pArray);
      p->vInfCubes->pArray = (void **)0x0;
      __ptr = p->vInfCubes;
      if (__ptr == (Vec_Ptr_t *)0x0) goto LAB_004dfb78;
    }
    free(__ptr);
  }
LAB_004dfb78:
  p->vInfCubes = vCubes;
  Vec_IntPush(p_00,p->pAig->nRegs);
  return p_00;
}

Assistant:

Vec_Int_t * Pdr_ManDeriveInfinityClauses( Pdr_Man_t * p, int fReduce )
{
    Vec_Int_t * vResult;
    Vec_Ptr_t * vCubes;
    Pdr_Set_t * pCube;
    int i, v, kStart;
    // collect cubes used in the inductive invariant
    kStart = Pdr_ManFindInvariantStart( p );
    vCubes = Pdr_ManCollectCubes( p, kStart );
    // refine as long as there are changes
    if ( fReduce )
        while ( Pdr_ManDeriveMarkNonInductive(p, vCubes) );
    // collect remaining clauses
    vResult = Vec_IntAlloc( 1000 );
    Vec_IntPush( vResult, 0 );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 ) // skip non-inductive
            continue;
        Vec_IntAddToEntry( vResult, 0, 1 );
        Vec_IntPush( vResult, pCube->nLits );
        for ( v = 0; v < pCube->nLits; v++ )
            Vec_IntPush( vResult, pCube->Lits[v] );
    }
    //Vec_PtrFree( vCubes );
    Vec_PtrFreeP( &p->vInfCubes );
    p->vInfCubes = vCubes;
    Vec_IntPush( vResult, Aig_ManRegNum(p->pAig) );
    return vResult;
}